

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lights.cpp
# Opt level: O3

void __thiscall DStrobe::Tick(DStrobe *this)

{
  int *piVar1;
  sector_t_conflict *psVar2;
  short sVar3;
  int iVar4;
  int iVar5;
  bool bVar6;
  
  piVar1 = &this->m_Count;
  *piVar1 = *piVar1 + -1;
  if (*piVar1 != 0) {
    return;
  }
  psVar2 = (this->super_DLighting).super_DSectorEffect.m_Sector;
  iVar4 = this->m_MinLight;
  bVar6 = iVar4 == psVar2->lightlevel;
  if (bVar6) {
    iVar4 = this->m_MaxLight;
  }
  iVar5 = 0x7fff;
  if (iVar4 < 0x7fff) {
    iVar5 = iVar4;
  }
  sVar3 = -0x8000;
  if (-0x8000 < iVar5) {
    sVar3 = (short)iVar5;
  }
  psVar2->lightlevel = sVar3;
  this->m_Count = (&this->m_DarkTime)[bVar6];
  return;
}

Assistant:

void DStrobe::Tick ()
{
	if (--m_Count == 0)
	{
		if (m_Sector->lightlevel == m_MinLight)
		{
			m_Sector->SetLightLevel(m_MaxLight);
			m_Count = m_BrightTime;
		}
		else
		{
			m_Sector->SetLightLevel(m_MinLight);
			m_Count = m_DarkTime;
		}
	}
}